

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

vector<const_psy::C::SyntaxTree_*,_std::allocator<const_psy::C::SyntaxTree_*>_> * __thiscall
psy::C::Compilation::syntaxTrees
          (vector<const_psy::C::SyntaxTree_*,_std::allocator<const_psy::C::SyntaxTree_*>_>
           *__return_storage_ptr__,Compilation *this)

{
  pointer pCVar1;
  size_type __n;
  iterator iVar2;
  iterator iVar3;
  back_insert_iterator<std::vector<const_psy::C::SyntaxTree_*,_std::allocator<const_psy::C::SyntaxTree_*>_>_>
  bVar4;
  allocator<const_psy::C::SyntaxTree_*> local_1a;
  undefined1 local_19;
  Compilation *local_18;
  Compilation *this_local;
  vector<const_psy::C::SyntaxTree_*,_std::allocator<const_psy::C::SyntaxTree_*>_> *trees;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Compilation *)__return_storage_ptr__;
  pCVar1 = std::
           unique_ptr<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
           ::operator->(&this->impl_);
  __n = std::
        unordered_map<const_psy::C::SyntaxTree_*,_std::unique_ptr<psy::C::SemanticModel,_std::default_delete<psy::C::SemanticModel>_>,_std::hash<const_psy::C::SyntaxTree_*>,_std::equal_to<const_psy::C::SyntaxTree_*>,_std::allocator<std::pair<const_psy::C::SyntaxTree_*const,_std::unique_ptr<psy::C::SemanticModel,_std::default_delete<psy::C::SemanticModel>_>_>_>_>
        ::size(&pCVar1->semaModels_);
  std::allocator<const_psy::C::SyntaxTree_*>::allocator(&local_1a);
  std::vector<const_psy::C::SyntaxTree_*,_std::allocator<const_psy::C::SyntaxTree_*>_>::vector
            (__return_storage_ptr__,__n,&local_1a);
  std::allocator<const_psy::C::SyntaxTree_*>::~allocator(&local_1a);
  pCVar1 = std::
           unique_ptr<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
           ::operator->(&this->impl_);
  iVar2 = std::
          unordered_map<const_psy::C::SyntaxTree_*,_std::unique_ptr<psy::C::SemanticModel,_std::default_delete<psy::C::SemanticModel>_>,_std::hash<const_psy::C::SyntaxTree_*>,_std::equal_to<const_psy::C::SyntaxTree_*>,_std::allocator<std::pair<const_psy::C::SyntaxTree_*const,_std::unique_ptr<psy::C::SemanticModel,_std::default_delete<psy::C::SemanticModel>_>_>_>_>
          ::begin(&pCVar1->semaModels_);
  pCVar1 = std::
           unique_ptr<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
           ::operator->(&this->impl_);
  iVar3 = std::
          unordered_map<const_psy::C::SyntaxTree_*,_std::unique_ptr<psy::C::SemanticModel,_std::default_delete<psy::C::SemanticModel>_>,_std::hash<const_psy::C::SyntaxTree_*>,_std::equal_to<const_psy::C::SyntaxTree_*>,_std::allocator<std::pair<const_psy::C::SyntaxTree_*const,_std::unique_ptr<psy::C::SemanticModel,_std::default_delete<psy::C::SemanticModel>_>_>_>_>
          ::end(&pCVar1->semaModels_);
  bVar4 = std::
          back_inserter<std::vector<psy::C::SyntaxTree_const*,std::allocator<psy::C::SyntaxTree_const*>>>
                    (__return_storage_ptr__);
  std::
  transform<std::__detail::_Node_iterator<std::pair<psy::C::SyntaxTree_const*const,std::unique_ptr<psy::C::SemanticModel,std::default_delete<psy::C::SemanticModel>>>,false,false>,std::back_insert_iterator<std::vector<psy::C::SyntaxTree_const*,std::allocator<psy::C::SyntaxTree_const*>>>,psy::C::Compilation::syntaxTrees()const::__0>
            (iVar2.
             super__Node_iterator_base<std::pair<const_psy::C::SyntaxTree_*const,_std::unique_ptr<psy::C::SemanticModel,_std::default_delete<psy::C::SemanticModel>_>_>,_false>
             ._M_cur,iVar3.
                     super__Node_iterator_base<std::pair<const_psy::C::SyntaxTree_*const,_std::unique_ptr<psy::C::SemanticModel,_std::default_delete<psy::C::SemanticModel>_>_>,_false>
                     ._M_cur,bVar4.container);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const SyntaxTree*> Compilation::syntaxTrees() const
{
    std::vector<const SyntaxTree*> trees(P->semaModels_.size());
    std::transform(P->semaModels_.begin(),
                   P->semaModels_.end(),
                   std::back_inserter(trees),
                   [] (const auto& kv) { return kv.first; });
    return  trees;
}